

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int pce_load_map(char *fname,int mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  t_symbol *ptVar4;
  FILE *__stream;
  ulong uVar5;
  int iVar6;
  int size;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uchar header [16];
  
  __stream = (FILE *)open_file(fname,"rb");
  if (__stream == (FILE *)0x0) {
    fatal_error("Can not open file!");
    mode = 1;
  }
  else {
    fread(header,1,0xc,__stream);
    if ((header._0_4_ == 0x4d524f46) && (header._8_4_ == 0x50414d46)) {
      uVar8 = (uint)header._4_4_ >> 0x18;
      uVar1 = header._4_4_ & 0xff0000;
      uVar2 = header._4_4_ & 0xff00;
      uVar3 = header._4_4_ << 0x18;
      labldef(loccnt,1);
      if (pass == 1) {
        loadlc(loccnt,0);
      }
      iVar7 = (uVar8 | uVar1 >> 8 | uVar2 << 8 | uVar3) - 4;
      while (size = 0, 0 < iVar7) {
        fread(header,1,8,__stream);
        uVar9 = (ulong)header[7] |
                (ulong)header[6] << 8 | (long)(int)(header._4_4_ << 0x18) | (ulong)header[5] << 0x10
        ;
        iVar7 = (iVar7 - (int)uVar9) + -8;
        size = 0;
        if (iVar7 < 0) break;
        if (header._0_4_ == 0x59444f42) {
          size = (int)((uint)header[7] |
                      (uint)((ulong)header[6] << 8) |
                      header._4_4_ << 0x18 | (uint)((ulong)header[5] << 0x10)) >> 1;
          if (pass == 1) {
            while (iVar7 = (int)uVar9, iVar7 != 0) {
              iVar6 = 0x200;
              if (iVar7 < 0x200) {
                iVar6 = iVar7;
              }
              fread(buffer,1,(long)iVar6,__stream);
              uVar8 = iVar6 >> 1;
              uVar9 = 0;
              if (0 < (int)uVar8) {
                uVar9 = (ulong)uVar8;
              }
              for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
                buffer[uVar5] = (char)(*(ushort *)(buffer + uVar5 * 2) >> 5) + 0xff;
              }
              putbuffer(buffer,uVar8);
              uVar9 = (ulong)(uint)(iVar7 - iVar6);
            }
          }
          else {
            putbuffer((void *)0x0,size);
          }
          break;
        }
        fseek(__stream,uVar9,1);
      }
      mode = 1;
      fclose(__stream);
      ptVar4 = lablptr;
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 7)) {
          lastlabl->data_size = lastlabl->data_size + size;
        }
      }
      else {
        lablptr->data_type = 7;
        ptVar4->data_size = size;
      }
      if (pass == 1) {
        println();
      }
    }
    else {
      if (mode != 0) {
        fatal_error("Invalid FMP format!");
      }
      fclose(__stream);
    }
  }
  return mode;
}

Assistant:

int
pce_load_map(char *fname, int mode)
{
	FILE *fp;
	unsigned char header[16];
	int fsize;
	int size;
	int nb;
	int cnt;
	int i, j;

	/* init */
	cnt = 0;

	/* open the file */
	if ((fp = open_file(fname, "rb")) == NULL) {
		fatal_error("Can not open file!");
		return (1);
	}

	/* check FMP header */
	fread(header, 1, 12, fp);
	fsize = (header[4] << 24) +
			(header[5] << 16) +
			(header[6] <<  8) +
			 header[7] - 4;

	if (memcmp(header, "FORM", 4) || memcmp(&header[8], "FMAP", 4)) {
		/* incorrect header */
		if (mode)
			fatal_error("Invalid FMP format!");
		fclose(fp);
		return(mode);
	}

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* browse chunks */
	while (fsize > 0) {
		fread(header, 1, 8, fp);
		size = (header[4] << 24) +
			   (header[5] << 16) +
			   (header[6] <<  8) +
			    header[7];
		fsize -= 8;
		fsize -= size;
		if (fsize < 0)
			break;

		/* BODY chunk */
		if (memcmp(header, "BODY", 4) == 0) {
			/* add size */
			cnt += (size >> 1);

			if (pass == LAST_PASS) {
				/* read chunk */
				while (size) {
					/* read a block */
					nb = (size > 512) ? 512 : size;
					fread(buffer, 1, nb, fp);
					size -= nb;
					nb >>= 1;

					/* convert word -> byte */
					for (i = 0, j = 0; i < nb; i++, j += 2)
						buffer[i] = ((buffer[j] + (buffer[j+1] << 8)) >> 5) - 1;

					/* output buffer */
					putbuffer(buffer, nb);
				}
			}
			else
				putbuffer(NULL, size >> 1);

			/* ok */
			break;
		}
		else {
			/* unsupported chunk */
			fseek(fp, size, SEEK_CUR);
		}
	}

	/* close file */
	fclose(fp);

	/* size */
	if (lablptr) {
		lablptr->data_type = P_INCBIN;
		lablptr->data_size = cnt;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_INCBIN)
				lastlabl->data_size += cnt;
		}
	}

	/* output line */
	if (pass == LAST_PASS)
		println();

	/* ok */
	return (1);
}